

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_back(void)

{
  reference piVar1;
  initializer_list<int> input;
  int local_74 [3];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  span.member.cap = 4;
  span.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.next = 4;
  local_74[0] = 0xb;
  local_74[1] = 0x16;
  local_74[2] = 0x21;
  input._M_len = 3;
  input._M_array = local_74;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  local_74[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe5,"void api_dynamic_suite::dynamic_back()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::push_front(&span,0x2c);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  local_74[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe7,"void api_dynamic_suite::dynamic_back()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::push_front(&span,0x37);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&span);
  local_74[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9,"void api_dynamic_suite::dynamic_back()",piVar1,local_74);
  return;
}

Assistant:

void dynamic_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.back(), 33);
    span.push_front(44);
    BOOST_TEST_EQ(span.back(), 33);
    span.push_front(55);
    BOOST_TEST_EQ(span.back(), 22);
}